

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman.cpp
# Opt level: O0

quint32 __thiscall
HPack::HuffmanDecoder::addTable(HuffmanDecoder *this,quint32 prefix,quint32 index)

{
  size_type sVar1;
  quint32 in_EDX;
  quint32 in_ESI;
  vector<HPack::PrefixTable,_std::allocator<HPack::PrefixTable>_> *in_RDI;
  long in_FS_OFFSET;
  PrefixTable newTable;
  value_type *in_stack_ffffffffffffffb8;
  vector<HPack::PrefixTable,_std::allocator<HPack::PrefixTable>_> *this_00;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  PrefixTable local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18.prefixLength = 0xaaaaaaaa;
  local_18.indexLength = 0xaaaaaaaa;
  local_18.offset = 0xaaaaaaaa;
  PrefixTable::PrefixTable(&local_18,in_ESI,in_EDX);
  this_00 = in_RDI + 1;
  sVar1 = std::vector<HPack::PrefixTableEntry,_std::allocator<HPack::PrefixTableEntry>_>::size
                    ((vector<HPack::PrefixTableEntry,_std::allocator<HPack::PrefixTableEntry>_> *)
                     this_00);
  local_18.offset = (quint32)sVar1;
  std::vector<HPack::PrefixTable,_std::allocator<HPack::PrefixTable>_>::push_back
            (this_00,in_stack_ffffffffffffffb8);
  std::vector<HPack::PrefixTableEntry,_std::allocator<HPack::PrefixTableEntry>_>::size
            ((vector<HPack::PrefixTableEntry,_std::allocator<HPack::PrefixTableEntry>_> *)this_00);
  PrefixTable::size(&local_18);
  std::vector<HPack::PrefixTableEntry,_std::allocator<HPack::PrefixTableEntry>_>::resize
            ((vector<HPack::PrefixTableEntry,_std::allocator<HPack::PrefixTableEntry>_> *)
             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),(size_type)in_RDI);
  sVar1 = std::vector<HPack::PrefixTable,_std::allocator<HPack::PrefixTable>_>::size(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (int)sVar1 - 1;
  }
  __stack_chk_fail();
}

Assistant:

quint32 HuffmanDecoder::addTable(quint32 prefix, quint32 index)
{
    PrefixTable newTable{prefix, index};
    newTable.offset = quint32(tableData.size());
    prefixTables.push_back(newTable);
    // Add entries for this table:
    tableData.resize(tableData.size() + newTable.size());

    return quint32(prefixTables.size() - 1);
}